

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O2

bool Js::JavascriptError::ThrowIfStrictModeUndefinedSetter
               (PropertyOperationFlags flags,Var setterValue,ScriptContext *scriptContext)

{
  bool bVar1;
  
  if (((flags & PropertyOperation_StrictMode) != PropertyOperation_None) &&
     (bVar1 = JavascriptOperators::IsUndefinedAccessor(setterValue,scriptContext), bVar1)) {
    bVar1 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
    if (!bVar1) {
      return true;
    }
    ThrowTypeError(scriptContext,-0x7ff5ec4b,(PCWSTR)0x0);
  }
  return false;
}

Assistant:

bool JavascriptError::ThrowIfStrictModeUndefinedSetter(
        PropertyOperationFlags flags, Var setterValue, ScriptContext* scriptContext)
    {
        if ((flags & PropertyOperation_StrictMode)
            && JavascriptOperators::IsUndefinedAccessor(setterValue, scriptContext))
        {
            if (scriptContext->GetThreadContext()->RecordImplicitException())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_CantAssignToReadOnly);
            }
            return true;
        }
        return false;
    }